

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_boundary_maximal_simplex_removal<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
               (void)

{
  pointer ppVar1;
  pointer pvVar2;
  Column_zp_settings *this;
  uint local_2ac;
  uint *local_2a8;
  uint *local_2a0;
  uint local_294;
  undefined1 local_290 [8];
  undefined8 local_288;
  shared_count sStack_280;
  undefined **local_278;
  undefined1 local_270;
  undefined8 *local_268;
  uint **local_260;
  undefined **local_258;
  undefined1 local_250;
  undefined8 *local_248;
  uint **local_240;
  undefined **local_238;
  undefined1 local_230;
  undefined8 *local_228;
  char *local_220;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>>
            ();
  this = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  ::Column_zp_settings::Column_zp_settings(this,5);
  m.colSettings_ = this;
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
  ::
  Boundary_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
              *)&m.matrix_,&columns,this);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
            (&columns,&m);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x359);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_001fa0f0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = "";
  local_2a0 = &local_2ac;
  local_2ac = (uint)m.matrix_.matrix_._M_h._M_element_count;
  local_2a8 = &local_294;
  local_294 = 7;
  local_290[0] = (uint)m.matrix_.matrix_._M_h._M_element_count == 7;
  local_288 = 0;
  sStack_280.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_240 = &local_2a0;
  local_250 = 0;
  local_258 = &PTR__lazy_ostream_001fa060;
  local_248 = &boost::unit_test::lazy_ostream::inst;
  local_260 = &local_2a8;
  local_270 = 0;
  local_278 = &PTR__lazy_ostream_001fa0b0;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_280);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x35b);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_001fa0f0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = "";
  if (m.matrix_.super_Base_pairing_option.isReduced_ == false) {
    Gudhi::persistence_matrix::
    Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
    ::_reduce(&m.matrix_.super_Base_pairing_option);
  }
  local_2a0 = &m.matrix_.super_Base_pairing_option.barcode_.
               super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].death;
  local_2ac = 6;
  local_290[0] = m.matrix_.super_Base_pairing_option.barcode_.
                 super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].death == 6;
  local_288 = 0;
  sStack_280.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_250 = 0;
  local_258 = &PTR__lazy_ostream_001fa060;
  local_248 = &boost::unit_test::lazy_ostream::inst;
  local_240 = &local_2a0;
  local_2a8 = &local_2ac;
  local_270 = 0;
  local_278 = &PTR__lazy_ostream_001fa0b0;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_260 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion
            (local_290,&local_238,&local_200,0x35b,1,2,2,"m.get_current_barcode().back().death",
             &local_258,"6",&local_278);
  boost::detail::shared_count::~shared_count(&sStack_280);
  Gudhi::persistence_matrix::
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
  ::remove_last(&m.matrix_);
  ppVar1 = columns.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = columns.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (ppVar1 != (pointer)0x0) {
    pvVar2 = columns.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    columns.
    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         columns.
         super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(ppVar1,(long)(pvVar2->
                                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar1)
    ;
    pvVar2 = columns.
             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  columns.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
  ppVar1 = columns.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (columns.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    columns.
    super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true>>>
            (&columns,&m);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x363);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_001fa0f0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = "";
  local_2ac = (uint)m.matrix_.matrix_._M_h._M_element_count;
  local_290[0] = (uint)m.matrix_.matrix_._M_h._M_element_count == 6;
  local_294 = 6;
  local_288 = 0;
  sStack_280.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_2a0 = &local_2ac;
  local_250 = 0;
  local_258 = &PTR__lazy_ostream_001fa060;
  local_248 = &boost::unit_test::lazy_ostream::inst;
  local_240 = &local_2a0;
  local_2a8 = &local_294;
  local_270 = 0;
  local_278 = &PTR__lazy_ostream_001fa0b0;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_260 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_280);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x364);
  local_230 = 0;
  local_238 = &PTR__lazy_ostream_001fa0f0;
  local_228 = &boost::unit_test::lazy_ostream::inst;
  local_220 = "";
  if (m.matrix_.super_Base_pairing_option.isReduced_ == false) {
    Gudhi::persistence_matrix::
    Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>_>
    ::_reduce(&m.matrix_.super_Base_pairing_option);
  }
  local_2a0 = &m.matrix_.super_Base_pairing_option.barcode_.
               super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].death;
  local_2ac = 0xffffffff;
  local_290[0] = m.matrix_.super_Base_pairing_option.barcode_.
                 super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].death == 0xffffffff;
  local_288 = 0;
  sStack_280.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_250 = 0;
  local_258 = &PTR__lazy_ostream_001fa060;
  local_248 = &boost::unit_test::lazy_ostream::inst;
  local_240 = &local_2a0;
  local_2a8 = &local_2ac;
  local_270 = 0;
  local_278 = &PTR__lazy_ostream_001fa060;
  local_268 = &boost::unit_test::lazy_ostream::inst;
  local_260 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion
            (local_290,&local_238,&local_200,0x364,1,2,2,"m.get_current_barcode().back().death",
             &local_258,"Matrix::template get_null_value<typename Matrix::ID_index>()",&local_278);
  boost::detail::shared_count::~shared_count(&sStack_280);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_boundary_maximal_simplex_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  // pairing always true for boundary for now (only thing differentiating it from base)
  BOOST_CHECK_EQUAL(m.get_current_barcode().back().death, 6);

  m.remove_last();

  columns.pop_back();
  columns[5].clear();  // was reduced

  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  BOOST_CHECK_EQUAL(m.get_current_barcode().back().death, Matrix::template get_null_value<typename Matrix::ID_index>());
}